

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void __thiscall l2r_l2_svc_fun::subXTv(l2r_l2_svc_fun *this,double *v,double *XTv)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  Reduce_Vectors *this_00;
  feature_node **ppfVar4;
  double **ppdVar5;
  int *piVar6;
  feature_node *pfVar7;
  double *pdVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  
  this_00 = this->reduce_vectors;
  ppfVar4 = this->prob->x;
  iVar2 = this_00->size;
  if (0 < (long)iVar2) {
    uVar3 = this_00->nr_thread;
    ppdVar5 = this_00->tmp_array;
    lVar11 = 0;
    do {
      if (0 < (int)uVar3) {
        uVar10 = 0;
        do {
          ppdVar5[uVar10][lVar11] = 0.0;
          uVar10 = uVar10 + 1;
        } while (uVar3 != uVar10);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar2);
  }
  iVar2 = this->sizeI;
  if (0 < (long)iVar2) {
    piVar6 = this->I;
    lVar11 = 0;
    do {
      pfVar7 = ppfVar4[piVar6[lVar11]];
      iVar9 = pfVar7->index;
      if (iVar9 != -1) {
        dVar1 = v[lVar11];
        pdVar8 = this_00->tmp_array[1];
        do {
          pdVar8[(long)iVar9 + -1] = pfVar7->value * dVar1 + pdVar8[(long)iVar9 + -1];
          iVar9 = pfVar7[1].index;
          pfVar7 = pfVar7 + 1;
        } while (iVar9 != -1);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar2);
  }
  Reduce_Vectors::reduce_sum(this_00,XTv);
  return;
}

Assistant:

void l2r_l2_svc_fun::subXTv(double *v, double *XTv)
{
	int i;
	feature_node **x=prob->x;

	reduce_vectors->init();

#ifdef ENABLED_OPENMP
#pragma omp parallel for private(i) schedule(guided)
#endif
	for(i=0;i<sizeI;i++)
		reduce_vectors->sum_scale_x(v[i], x[I[i]]);

	reduce_vectors->reduce_sum(XTv);
}